

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::gen_transform_feedbacks(NegativeTestContext *ctx)

{
  GLuint local_48 [2];
  GLuint id;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GL_INVALID_VALUE is generated if n is negative.",&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  local_48[0] = 0;
  glu::CallLogWrapper::glGenTransformFeedbacks(&local_10->super_CallLogWrapper,-1,local_48);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void gen_transform_feedbacks (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_VALUE is generated if n is negative.");
	GLuint id = 0;
	ctx.glGenTransformFeedbacks(-1, &id);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}